

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

bool cppcms::xss::anon_unknown_8::ends_with(char **begin,char *end,char *value)

{
  int iVar1;
  size_t __n;
  char *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  size_t len;
  undefined1 local_1;
  
  __n = strlen(in_RDX);
  if ((*in_RDI < in_RSI) && (__n <= in_RSI - *in_RDI)) {
    iVar1 = memcmp((void *)*in_RDI,in_RDX,__n);
    if (iVar1 == 0) {
      *in_RDI = __n + *in_RDI;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ends_with(char const *&begin,char const *end,char const *value)
		{
			size_t len=strlen(value);
			if(begin >= end || size_t(end - begin) < len)
				return false;
			if(memcmp(begin,value,len)==0) {
				begin+=len;
				return true;
			}
			return false;
		}